

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccoefct.c
# Opt level: O1

boolean compress_first_pass(j_compress_ptr cinfo,JSAMPIMAGE input_buf)

{
  JCOEF JVar1;
  uint uVar2;
  jpeg_c_coef_controller *pjVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  uint uVar10;
  boolean bVar11;
  JBLOCKARRAY ppaJVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  JSAMPIMAGE input_buf_00;
  jpeg_component_info *pjVar19;
  ulong uVar20;
  JBLOCKROW target;
  JBLOCKROW paJVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar38;
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  int iVar50;
  int iVar57;
  int iVar58;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar59;
  int iVar63;
  undefined1 in_XMM7 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar67 [16];
  int iVar68;
  long lVar25;
  
  input_buf_00 = input_buf;
  if (0 < cinfo->num_components) {
    uVar9 = cinfo->total_iMCU_rows - 1;
    pjVar19 = cinfo->comp_info;
    pjVar3 = cinfo->coef;
    lVar14 = 0;
    do {
      ppaJVar12 = (*cinfo->mem->access_virt_barray)
                            ((j_common_ptr)cinfo,(jvirt_barray_ptr)(&pjVar3[7].start_pass)[lVar14],
                             *(int *)&pjVar3[1].start_pass * pjVar19->v_samp_factor,
                             pjVar19->v_samp_factor,1);
      if (*(uint *)&pjVar3[1].start_pass < uVar9) {
        uVar10 = pjVar19->v_samp_factor;
      }
      else {
        uVar10 = pjVar19->height_in_blocks % (uint)pjVar19->v_samp_factor;
        if (uVar10 == 0) {
          uVar10 = pjVar19->v_samp_factor;
        }
      }
      uVar16 = pjVar19->width_in_blocks;
      uVar18 = (ulong)uVar16;
      uVar2 = pjVar19->h_samp_factor;
      iVar57 = (int)(uVar18 % (ulong)uVar2);
      uVar17 = (ulong)(uVar2 - iVar57);
      if (iVar57 < 1) {
        uVar17 = uVar18 % (ulong)uVar2;
      }
      iVar57 = (int)uVar17;
      if (0 < (int)uVar10) {
        lVar13 = uVar17 - 1;
        auVar67._8_4_ = (int)lVar13;
        auVar67._0_8_ = lVar13;
        auVar67._12_4_ = (int)((ulong)lVar13 >> 0x20);
        auVar67 = auVar67 ^ _DAT_00158050;
        uVar20 = 0;
        do {
          paJVar21 = ppaJVar12[uVar20];
          (*cinfo->fdct->forward_DCT)
                    (cinfo,pjVar19,input_buf[lVar14],paJVar21,(int)uVar20 * 8,0,uVar16);
          if (0 < iVar57) {
            jzero_far(paJVar21 + uVar18,uVar17 << 7);
            in_XMM9 = _DAT_00158050;
            auVar36._8_4_ = 0xffffffff;
            auVar36._0_8_ = 0xffffffffffffffff;
            auVar36._12_4_ = 0xffffffff;
            JVar1 = paJVar21[uVar18 - 1][0];
            lVar13 = 0;
            auVar22 = _DAT_00158000;
            auVar26 = _DAT_00158040;
            auVar28 = _DAT_00158030;
            auVar30 = _DAT_00158020;
            do {
              auVar32 = auVar22 ^ in_XMM9;
              iVar38 = auVar67._0_4_;
              iVar50 = -(uint)(iVar38 < auVar32._0_4_);
              iVar59 = auVar67._4_4_;
              auVar33._4_4_ = -(uint)(iVar59 < auVar32._4_4_);
              iVar63 = auVar67._8_4_;
              iVar58 = -(uint)(iVar63 < auVar32._8_4_);
              iVar68 = auVar67._12_4_;
              auVar33._12_4_ = -(uint)(iVar68 < auVar32._12_4_);
              auVar41._4_4_ = iVar50;
              auVar41._0_4_ = iVar50;
              auVar41._8_4_ = iVar58;
              auVar41._12_4_ = iVar58;
              auVar60 = pshuflw(in_XMM7,auVar41,0xe8);
              auVar39._4_4_ = -(uint)(auVar32._4_4_ == iVar59);
              auVar39._12_4_ = -(uint)(auVar32._12_4_ == iVar68);
              auVar39._0_4_ = auVar39._4_4_;
              auVar39._8_4_ = auVar39._12_4_;
              auVar64 = pshuflw(in_XMM8,auVar39,0xe8);
              auVar33._0_4_ = auVar33._4_4_;
              auVar33._8_4_ = auVar33._12_4_;
              auVar32 = pshuflw(auVar60,auVar33,0xe8);
              auVar32 = (auVar32 | auVar64 & auVar60) ^ auVar36;
              auVar32 = packssdw(auVar32,auVar32);
              if ((auVar32 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(JCOEF *)((long)paJVar21[uVar18] + lVar13) = JVar1;
              }
              auVar33 = auVar39 & auVar41 | auVar33;
              auVar32 = packssdw(auVar33,auVar33);
              auVar32 = packssdw(auVar32 ^ auVar36,auVar32 ^ auVar36);
              if ((auVar32._0_4_ >> 0x10 & 1) != 0) {
                *(JCOEF *)((long)paJVar21[uVar18 + 1] + lVar13) = JVar1;
              }
              auVar39 = auVar26 ^ in_XMM9;
              iVar50 = -(uint)(iVar38 < auVar39._0_4_);
              auVar51._4_4_ = -(uint)(iVar59 < auVar39._4_4_);
              iVar58 = -(uint)(iVar63 < auVar39._8_4_);
              auVar51._12_4_ = -(uint)(iVar68 < auVar39._12_4_);
              auVar32._4_4_ = iVar50;
              auVar32._0_4_ = iVar50;
              auVar32._8_4_ = iVar58;
              auVar32._12_4_ = iVar58;
              auVar40._4_4_ = -(uint)(auVar39._4_4_ == iVar59);
              auVar40._12_4_ = -(uint)(auVar39._12_4_ == iVar68);
              auVar40._0_4_ = auVar40._4_4_;
              auVar40._8_4_ = auVar40._12_4_;
              auVar51._0_4_ = auVar51._4_4_;
              auVar51._8_4_ = auVar51._12_4_;
              auVar39 = auVar40 & auVar32 | auVar51;
              auVar39 = packssdw(auVar39,auVar39);
              auVar39 = packssdw(auVar39 ^ auVar36,auVar39 ^ auVar36);
              if ((auVar39 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(JCOEF *)((long)paJVar21[uVar18 + 2] + lVar13) = JVar1;
              }
              auVar32 = pshufhw(auVar32,auVar32,0x84);
              auVar41 = pshufhw(auVar40,auVar40,0x84);
              auVar33 = pshufhw(auVar32,auVar51,0x84);
              auVar32 = (auVar33 | auVar41 & auVar32) ^ auVar36;
              auVar32 = packssdw(auVar32,auVar32);
              if ((auVar32 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(JCOEF *)((long)paJVar21[uVar18 + 3] + lVar13) = JVar1;
              }
              auVar32 = auVar28 ^ in_XMM9;
              iVar50 = -(uint)(iVar38 < auVar32._0_4_);
              auVar35._4_4_ = -(uint)(iVar59 < auVar32._4_4_);
              iVar58 = -(uint)(iVar63 < auVar32._8_4_);
              auVar35._12_4_ = -(uint)(iVar68 < auVar32._12_4_);
              auVar42._4_4_ = iVar50;
              auVar42._0_4_ = iVar50;
              auVar42._8_4_ = iVar58;
              auVar42._12_4_ = iVar58;
              auVar39 = pshuflw(auVar39,auVar42,0xe8);
              auVar34._4_4_ = -(uint)(auVar32._4_4_ == iVar59);
              auVar34._12_4_ = -(uint)(auVar32._12_4_ == iVar68);
              auVar34._0_4_ = auVar34._4_4_;
              auVar34._8_4_ = auVar34._12_4_;
              in_XMM8 = pshuflw(auVar64 & auVar60,auVar34,0xe8);
              in_XMM8 = in_XMM8 & auVar39;
              auVar35._0_4_ = auVar35._4_4_;
              auVar35._8_4_ = auVar35._12_4_;
              auVar32 = pshuflw(auVar39,auVar35,0xe8);
              auVar32 = (auVar32 | in_XMM8) ^ auVar36;
              auVar32 = packssdw(auVar32,auVar32);
              if ((auVar32 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(JCOEF *)((long)paJVar21[uVar18 + 4] + lVar13) = JVar1;
              }
              auVar35 = auVar34 & auVar42 | auVar35;
              auVar32 = packssdw(auVar35,auVar35);
              auVar32 = packssdw(auVar32 ^ auVar36,auVar32 ^ auVar36);
              if ((auVar32 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                *(JCOEF *)((long)paJVar21[uVar18 + 5] + lVar13) = JVar1;
              }
              auVar32 = auVar30 ^ in_XMM9;
              iVar50 = -(uint)(iVar38 < auVar32._0_4_);
              auVar52._4_4_ = -(uint)(iVar59 < auVar32._4_4_);
              iVar58 = -(uint)(iVar63 < auVar32._8_4_);
              auVar52._12_4_ = -(uint)(iVar68 < auVar32._12_4_);
              auVar60._4_4_ = iVar50;
              auVar60._0_4_ = iVar50;
              auVar60._8_4_ = iVar58;
              auVar60._12_4_ = iVar58;
              auVar64._4_4_ = -(uint)(auVar32._4_4_ == iVar59);
              auVar64._12_4_ = -(uint)(auVar32._12_4_ == iVar68);
              auVar64._0_4_ = auVar64._4_4_;
              auVar64._8_4_ = auVar64._12_4_;
              auVar52._0_4_ = auVar52._4_4_;
              auVar52._8_4_ = auVar52._12_4_;
              auVar32 = auVar64 & auVar60 | auVar52;
              auVar32 = packssdw(auVar32,auVar32);
              in_XMM7 = packssdw(auVar32 ^ auVar36,auVar32 ^ auVar36);
              if ((in_XMM7 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(JCOEF *)((long)paJVar21[uVar18 + 6] + lVar13) = JVar1;
              }
              auVar32 = pshufhw(auVar60,auVar60,0x84);
              auVar33 = pshufhw(auVar64,auVar64,0x84);
              auVar39 = pshufhw(auVar32,auVar52,0x84);
              auVar32 = (auVar39 | auVar33 & auVar32) ^ auVar36;
              auVar32 = packssdw(auVar32,auVar32);
              if ((auVar32 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(JCOEF *)((long)paJVar21[uVar18 + 7] + lVar13) = JVar1;
              }
              lVar15 = auVar22._8_8_;
              auVar22._0_8_ = auVar22._0_8_ + 8;
              auVar22._8_8_ = lVar15 + 8;
              lVar15 = auVar26._8_8_;
              auVar26._0_8_ = auVar26._0_8_ + 8;
              auVar26._8_8_ = lVar15 + 8;
              lVar15 = auVar28._8_8_;
              auVar28._0_8_ = auVar28._0_8_ + 8;
              auVar28._8_8_ = lVar15 + 8;
              lVar15 = auVar30._8_8_;
              auVar30._0_8_ = auVar30._0_8_ + 8;
              auVar30._8_8_ = lVar15 + 8;
              lVar13 = lVar13 + 0x400;
            } while ((ulong)(iVar57 + 7U >> 3) << 10 != lVar13);
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar10);
      }
      input_buf_00 = (JSAMPIMAGE)(ulong)uVar10;
      if (*(uint *)&pjVar3[1].start_pass == uVar9) {
        uVar16 = iVar57 + uVar16;
        if ((int)uVar10 < pjVar19->v_samp_factor) {
          lVar15 = (long)(int)uVar10;
          lVar13 = (ulong)uVar2 - 1;
          auVar23._8_4_ = (int)lVar13;
          auVar23._0_8_ = lVar13;
          auVar23._12_4_ = (int)((ulong)lVar13 >> 0x20);
          do {
            paJVar21 = ppaJVar12[lVar15 + -1];
            target = ppaJVar12[lVar15];
            input_buf_00 = (JSAMPIMAGE)((ulong)uVar16 << 7);
            jzero_far(target,(size_t)((ulong)uVar16 << 7));
            auVar30 = _DAT_00158050;
            auVar28 = _DAT_00158040;
            auVar26 = _DAT_00158030;
            auVar22 = _DAT_00158020;
            auVar67 = _DAT_00158000;
            if (uVar2 <= uVar16) {
              uVar10 = 0;
              do {
                if (0 < (int)uVar2) {
                  JVar1 = paJVar21[(long)(int)uVar2 + -1][0];
                  lVar13 = 0;
                  auVar24 = auVar67;
                  auVar27 = auVar28;
                  auVar29 = auVar26;
                  auVar31 = auVar22;
                  do {
                    auVar36 = auVar23 ^ auVar30;
                    auVar32 = auVar24 ^ auVar30;
                    iVar57 = auVar36._0_4_;
                    iVar59 = -(uint)(iVar57 < auVar32._0_4_);
                    iVar50 = auVar36._4_4_;
                    auVar44._4_4_ = -(uint)(iVar50 < auVar32._4_4_);
                    iVar58 = auVar36._8_4_;
                    iVar63 = -(uint)(iVar58 < auVar32._8_4_);
                    iVar38 = auVar36._12_4_;
                    auVar44._12_4_ = -(uint)(iVar38 < auVar32._12_4_);
                    auVar53._4_4_ = iVar59;
                    auVar53._0_4_ = iVar59;
                    auVar53._8_4_ = iVar63;
                    auVar53._12_4_ = iVar63;
                    auVar36 = pshuflw(in_XMM8,auVar53,0xe8);
                    auVar43._4_4_ = -(uint)(auVar32._4_4_ == iVar50);
                    auVar43._12_4_ = -(uint)(auVar32._12_4_ == iVar38);
                    auVar43._0_4_ = auVar43._4_4_;
                    auVar43._8_4_ = auVar43._12_4_;
                    auVar39 = pshuflw(in_XMM9,auVar43,0xe8);
                    auVar44._0_4_ = auVar44._4_4_;
                    auVar44._8_4_ = auVar44._12_4_;
                    auVar32 = pshuflw(auVar36,auVar44,0xe8);
                    auVar65._8_4_ = 0xffffffff;
                    auVar65._0_8_ = 0xffffffffffffffff;
                    auVar65._12_4_ = 0xffffffff;
                    auVar65 = (auVar32 | auVar39 & auVar36) ^ auVar65;
                    auVar32 = packssdw(auVar65,auVar65);
                    if ((auVar32 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(JCOEF *)((long)*target + lVar13) = JVar1;
                    }
                    auVar44 = auVar43 & auVar53 | auVar44;
                    auVar32 = packssdw(auVar44,auVar44);
                    auVar4._8_4_ = 0xffffffff;
                    auVar4._0_8_ = 0xffffffffffffffff;
                    auVar4._12_4_ = 0xffffffff;
                    auVar32 = packssdw(auVar32 ^ auVar4,auVar32 ^ auVar4);
                    if ((auVar32._0_4_ >> 0x10 & 1) != 0) {
                      *(JCOEF *)((long)target[1] + lVar13) = JVar1;
                    }
                    auVar32 = auVar27 ^ auVar30;
                    iVar59 = -(uint)(iVar57 < auVar32._0_4_);
                    auVar61._4_4_ = -(uint)(iVar50 < auVar32._4_4_);
                    iVar63 = -(uint)(iVar58 < auVar32._8_4_);
                    auVar61._12_4_ = -(uint)(iVar38 < auVar32._12_4_);
                    auVar45._4_4_ = iVar59;
                    auVar45._0_4_ = iVar59;
                    auVar45._8_4_ = iVar63;
                    auVar45._12_4_ = iVar63;
                    auVar54._4_4_ = -(uint)(auVar32._4_4_ == iVar50);
                    auVar54._12_4_ = -(uint)(auVar32._12_4_ == iVar38);
                    auVar54._0_4_ = auVar54._4_4_;
                    auVar54._8_4_ = auVar54._12_4_;
                    auVar61._0_4_ = auVar61._4_4_;
                    auVar61._8_4_ = auVar61._12_4_;
                    auVar32 = auVar54 & auVar45 | auVar61;
                    auVar32 = packssdw(auVar32,auVar32);
                    auVar5._8_4_ = 0xffffffff;
                    auVar5._0_8_ = 0xffffffffffffffff;
                    auVar5._12_4_ = 0xffffffff;
                    auVar32 = packssdw(auVar32 ^ auVar5,auVar32 ^ auVar5);
                    if ((auVar32 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(JCOEF *)((long)target[2] + lVar13) = JVar1;
                    }
                    auVar33 = pshufhw(auVar45,auVar45,0x84);
                    auVar60 = pshufhw(auVar54,auVar54,0x84);
                    auVar41 = pshufhw(auVar33,auVar61,0x84);
                    auVar46._8_4_ = 0xffffffff;
                    auVar46._0_8_ = 0xffffffffffffffff;
                    auVar46._12_4_ = 0xffffffff;
                    auVar46 = (auVar41 | auVar60 & auVar33) ^ auVar46;
                    auVar33 = packssdw(auVar46,auVar46);
                    if ((auVar33 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(JCOEF *)((long)target[3] + lVar13) = JVar1;
                    }
                    auVar33 = auVar29 ^ auVar30;
                    iVar59 = -(uint)(iVar57 < auVar33._0_4_);
                    auVar48._4_4_ = -(uint)(iVar50 < auVar33._4_4_);
                    iVar63 = -(uint)(iVar58 < auVar33._8_4_);
                    auVar48._12_4_ = -(uint)(iVar38 < auVar33._12_4_);
                    auVar55._4_4_ = iVar59;
                    auVar55._0_4_ = iVar59;
                    auVar55._8_4_ = iVar63;
                    auVar55._12_4_ = iVar63;
                    auVar32 = pshuflw(auVar32,auVar55,0xe8);
                    auVar47._4_4_ = -(uint)(auVar33._4_4_ == iVar50);
                    auVar47._12_4_ = -(uint)(auVar33._12_4_ == iVar38);
                    auVar47._0_4_ = auVar47._4_4_;
                    auVar47._8_4_ = auVar47._12_4_;
                    in_XMM9 = pshuflw(auVar39 & auVar36,auVar47,0xe8);
                    in_XMM9 = in_XMM9 & auVar32;
                    auVar48._0_4_ = auVar48._4_4_;
                    auVar48._8_4_ = auVar48._12_4_;
                    auVar36 = pshuflw(auVar32,auVar48,0xe8);
                    auVar66._8_4_ = 0xffffffff;
                    auVar66._0_8_ = 0xffffffffffffffff;
                    auVar66._12_4_ = 0xffffffff;
                    auVar66 = (auVar36 | in_XMM9) ^ auVar66;
                    auVar36 = packssdw(auVar66,auVar66);
                    if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(JCOEF *)((long)target[4] + lVar13) = JVar1;
                    }
                    auVar48 = auVar47 & auVar55 | auVar48;
                    auVar36 = packssdw(auVar48,auVar48);
                    auVar6._8_4_ = 0xffffffff;
                    auVar6._0_8_ = 0xffffffffffffffff;
                    auVar6._12_4_ = 0xffffffff;
                    auVar36 = packssdw(auVar36 ^ auVar6,auVar36 ^ auVar6);
                    if ((auVar36 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                      *(JCOEF *)((long)target[5] + lVar13) = JVar1;
                    }
                    auVar36 = auVar31 ^ auVar30;
                    auVar62._0_4_ = -(uint)(iVar57 < auVar36._0_4_);
                    auVar62._4_4_ = -(uint)(iVar50 < auVar36._4_4_);
                    auVar62._8_4_ = -(uint)(iVar58 < auVar36._8_4_);
                    auVar62._12_4_ = -(uint)(iVar38 < auVar36._12_4_);
                    auVar49._4_4_ = auVar62._0_4_;
                    auVar49._0_4_ = auVar62._0_4_;
                    auVar49._8_4_ = auVar62._8_4_;
                    auVar49._12_4_ = auVar62._8_4_;
                    iVar57 = -(uint)(auVar36._4_4_ == iVar50);
                    iVar50 = -(uint)(auVar36._12_4_ == iVar38);
                    auVar37._4_4_ = iVar57;
                    auVar37._0_4_ = iVar57;
                    auVar37._8_4_ = iVar50;
                    auVar37._12_4_ = iVar50;
                    auVar56._4_4_ = auVar62._4_4_;
                    auVar56._0_4_ = auVar62._4_4_;
                    auVar56._8_4_ = auVar62._12_4_;
                    auVar56._12_4_ = auVar62._12_4_;
                    in_XMM8 = auVar37 & auVar49 | auVar56;
                    auVar36 = packssdw(auVar62,in_XMM8);
                    auVar7._8_4_ = 0xffffffff;
                    auVar7._0_8_ = 0xffffffffffffffff;
                    auVar7._12_4_ = 0xffffffff;
                    in_XMM7 = packssdw(auVar36 ^ auVar7,auVar36 ^ auVar7);
                    if ((in_XMM7 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(JCOEF *)((long)target[6] + lVar13) = JVar1;
                    }
                    auVar32 = pshufhw(auVar49,auVar49,0x84);
                    auVar36 = pshufhw(auVar37,auVar37,0x84);
                    auVar39 = pshufhw(auVar32,auVar56,0x84);
                    auVar8._8_4_ = 0xffffffff;
                    auVar8._0_8_ = 0xffffffffffffffff;
                    auVar8._12_4_ = 0xffffffff;
                    auVar36 = packssdw(auVar36 & auVar32,(auVar39 | auVar36 & auVar32) ^ auVar8);
                    input_buf_00 = (JSAMPIMAGE)(ulong)auVar36._14_2_;
                    if ((auVar36 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(JCOEF *)((long)target[7] + lVar13) = JVar1;
                    }
                    lVar25 = auVar24._8_8_;
                    auVar24._0_8_ = auVar24._0_8_ + 8;
                    auVar24._8_8_ = lVar25 + 8;
                    lVar25 = auVar27._8_8_;
                    auVar27._0_8_ = auVar27._0_8_ + 8;
                    auVar27._8_8_ = lVar25 + 8;
                    lVar25 = auVar29._8_8_;
                    auVar29._0_8_ = auVar29._0_8_ + 8;
                    auVar29._8_8_ = lVar25 + 8;
                    lVar25 = auVar31._8_8_;
                    auVar31._0_8_ = auVar31._0_8_ + 8;
                    auVar31._8_8_ = lVar25 + 8;
                    lVar13 = lVar13 + 0x400;
                  } while ((ulong)(uVar2 + 7 >> 3) << 10 != lVar13);
                }
                paJVar21 = paJVar21 + (int)uVar2;
                uVar10 = uVar10 + 1;
                target = target + (int)uVar2;
              } while (uVar10 < uVar16 / uVar2);
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 < pjVar19->v_samp_factor);
        }
      }
      lVar14 = lVar14 + 1;
      pjVar19 = pjVar19 + 1;
    } while (lVar14 < cinfo->num_components);
  }
  bVar11 = compress_output(cinfo,input_buf_00);
  return bVar11;
}

Assistant:

METHODDEF(boolean)
compress_first_pass(j_compress_ptr cinfo, JSAMPIMAGE input_buf)
{
  my_coef_ptr coef = (my_coef_ptr)cinfo->coef;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  JDIMENSION blocks_across, MCUs_across, MCUindex;
  int bi, ci, h_samp_factor, block_row, block_rows, ndummy;
  JCOEF lastDC;
  jpeg_component_info *compptr;
  JBLOCKARRAY buffer;
  JBLOCKROW thisblockrow, lastblockrow;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Align the virtual buffer for this component. */
    buffer = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr)cinfo, coef->whole_image[ci],
       coef->iMCU_row_num * compptr->v_samp_factor,
       (JDIMENSION)compptr->v_samp_factor, TRUE);
    /* Count non-dummy DCT block rows in this iMCU row. */
    if (coef->iMCU_row_num < last_iMCU_row)
      block_rows = compptr->v_samp_factor;
    else {
      /* NB: can't use last_row_height here, since may not be set! */
      block_rows = (int)(compptr->height_in_blocks % compptr->v_samp_factor);
      if (block_rows == 0) block_rows = compptr->v_samp_factor;
    }
    blocks_across = compptr->width_in_blocks;
    h_samp_factor = compptr->h_samp_factor;
    /* Count number of dummy blocks to be added at the right margin. */
    ndummy = (int)(blocks_across % h_samp_factor);
    if (ndummy > 0)
      ndummy = h_samp_factor - ndummy;
    /* Perform DCT for all non-dummy blocks in this iMCU row.  Each call
     * on forward_DCT processes a complete horizontal row of DCT blocks.
     */
    for (block_row = 0; block_row < block_rows; block_row++) {
      thisblockrow = buffer[block_row];
      (*cinfo->fdct->forward_DCT) (cinfo, compptr,
                                   input_buf[ci], thisblockrow,
                                   (JDIMENSION)(block_row * DCTSIZE),
                                   (JDIMENSION)0, blocks_across);
      if (ndummy > 0) {
        /* Create dummy blocks at the right edge of the image. */
        thisblockrow += blocks_across; /* => first dummy block */
        jzero_far((void *)thisblockrow, ndummy * sizeof(JBLOCK));
        lastDC = thisblockrow[-1][0];
        for (bi = 0; bi < ndummy; bi++) {
          thisblockrow[bi][0] = lastDC;
        }
      }
    }
    /* If at end of image, create dummy block rows as needed.
     * The tricky part here is that within each MCU, we want the DC values
     * of the dummy blocks to match the last real block's DC value.
     * This squeezes a few more bytes out of the resulting file...
     */
    if (coef->iMCU_row_num == last_iMCU_row) {
      blocks_across += ndummy;  /* include lower right corner */
      MCUs_across = blocks_across / h_samp_factor;
      for (block_row = block_rows; block_row < compptr->v_samp_factor;
           block_row++) {
        thisblockrow = buffer[block_row];
        lastblockrow = buffer[block_row - 1];
        jzero_far((void *)thisblockrow,
                  (size_t)(blocks_across * sizeof(JBLOCK)));
        for (MCUindex = 0; MCUindex < MCUs_across; MCUindex++) {
          lastDC = lastblockrow[h_samp_factor - 1][0];
          for (bi = 0; bi < h_samp_factor; bi++) {
            thisblockrow[bi][0] = lastDC;
          }
          thisblockrow += h_samp_factor; /* advance to next MCU in row */
          lastblockrow += h_samp_factor;
        }
      }
    }
  }
  /* NB: compress_output will increment iMCU_row_num if successful.
   * A suspension return will result in redoing all the work above next time.
   */

  /* Emit data to the entropy encoder, sharing code with subsequent passes */
  return compress_output(cinfo, input_buf);
}